

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placeholder_impl.cpp
# Opt level: O0

void __thiscall ui::PlaceHolderImpl::~PlaceHolderImpl(PlaceHolderImpl *this)

{
  PlaceHolderImpl *this_local;
  
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__PlaceHolderImpl_002187e0;
  std::__cxx11::string::~string((string *)&this->title_);
  PanelBase::~PanelBase(&this->super_PanelBase);
  return;
}

Assistant:

PlaceHolderImpl(std::string title) : title_(title) {}